

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O3

Time __thiscall Storage::Disk::IPF::bit_length(IPF *this,Density density,int block)

{
  Time TVar1;
  Time TVar3;
  Time TVar4;
  Time TVar5;
  Time TVar2;
  
  switch(density) {
  case CopylockAmiga:
    block = block - 4;
  case CopylockAmigaNew:
    if ((uint)block < 3) {
      return (Time)((ulong)(uint)(block * 10) + 0x5f5e100000000bd);
    }
    break;
  case CopylockST:
    if (block == 5) {
      TVar1.length = 0x15;
      TVar1.clock_rate = 10000000;
      return TVar1;
    }
    break;
  case SpeedlockAmiga:
    TVar5.length = 1;
    TVar5.clock_rate = 500000;
    if (block == 2) {
      TVar5.length = 9;
      TVar5.clock_rate = 5000000;
    }
    TVar3.length = 0xb;
    TVar3.clock_rate = 5000000;
    if (block != 1) {
      TVar3 = TVar5;
    }
    return TVar3;
  case OldSpeedlockAmiga:
    if (block == 1) {
      TVar2.length = 0x15;
      TVar2.clock_rate = 10000000;
      return TVar2;
    }
    break;
  case AdamBrierleyAmiga:
    if (block - 1U < 6) {
      return *(Time *)(&DAT_004df260 + (ulong)(block - 1U) * 8);
    }
  }
  TVar4.length = 1;
  TVar4.clock_rate = 500000;
  return TVar4;
}

Assistant:

Storage::Time IPF::bit_length(TrackDescription::Density density, int block) {
	constexpr unsigned int us = 100'000'000;
	static constexpr auto us170 = Storage::Time::simplified(170, us);
	static constexpr auto us180 = Storage::Time::simplified(180, us);
	static constexpr auto us189 = Storage::Time::simplified(189, us);
	static constexpr auto us190 = Storage::Time::simplified(190, us);
	static constexpr auto us199 = Storage::Time::simplified(199, us);
	static constexpr auto us200 = Storage::Time::simplified(200, us);
	static constexpr auto us209 = Storage::Time::simplified(209, us);
	static constexpr auto us210 = Storage::Time::simplified(210, us);
	static constexpr auto us220 = Storage::Time::simplified(220, us);

	switch(density) {
		default:
		break;

		case TrackDescription::Density::CopylockAmiga:
			if(block == 4) return us189;
			if(block == 5) return us199;
			if(block == 6) return us209;
		break;

		case TrackDescription::Density::CopylockAmigaNew:
			if(block == 0) return us189;
			if(block == 1) return us199;
			if(block == 2) return us209;
		break;

		case TrackDescription::Density::CopylockST:
			if(block == 5) return us210;
		break;

		case TrackDescription::Density::SpeedlockAmiga:
			if(block == 1) return us220;
			if(block == 2) return us180;
		break;

		case TrackDescription::Density::OldSpeedlockAmiga:
			if(block == 1) return us210;
		break;

		case TrackDescription::Density::AdamBrierleyAmiga:
			if(block == 1) return us220;
			if(block == 2) return us210;
			if(block == 3) return us200;
			if(block == 4) return us190;
			if(block == 5) return us180;
			if(block == 6) return us170;
		break;

		// TODO: AdamBrierleyDensityKeyAmiga.
	}

	return us200;	// i.e. default to 2µs.
}